

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O3

void __thiscall clara::detail::BasicResult<void>::enforceOk(BasicResult<void> *this)

{
  Type TVar1;
  
  TVar1 = (this->super_ResultValueBase<void>).super_ResultBase.m_type;
  if (TVar1 == Ok) {
    return;
  }
  if (TVar1 != RuntimeError) {
    if (TVar1 == LogicError) {
      __assert_fail("m_type != ResultBase::LogicError",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Tests/ScsTest/../../External/Clara/clara.hpp"
                    ,0x252,"virtual void clara::detail::BasicResult<>::enforceOk() const [T = void]"
                   );
    }
    abort();
  }
  __assert_fail("m_type != ResultBase::RuntimeError",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Tests/ScsTest/../../External/Clara/clara.hpp"
                ,0x253,"virtual void clara::detail::BasicResult<>::enforceOk() const [T = void]");
}

Assistant:

void enforceOk() const override {

            // Errors shouldn't reach this point, but if they do
            // the actual error message will be in m_errorMessage
            assert( m_type != ResultBase::LogicError );
            assert( m_type != ResultBase::RuntimeError );
            if( m_type != ResultBase::Ok )
                std::abort();
        }